

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O2

void __thiscall Gnuplot::Gnuplot(Gnuplot *this,string *style)

{
  this->gnucmd = (FILE *)0x0;
  this->valid = false;
  this->two_dim = false;
  this->nplots = 0;
  (this->pstyle)._M_dataplus._M_p = (pointer)&(this->pstyle).field_2;
  (this->pstyle)._M_string_length = 0;
  (this->pstyle).field_2._M_local_buf[0] = '\0';
  (this->smooth)._M_dataplus._M_p = (pointer)&(this->smooth).field_2;
  (this->smooth)._M_string_length = 0;
  (this->smooth).field_2._M_local_buf[0] = '\0';
  (this->tmpfile_list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tmpfile_list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tmpfile_list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  init(this,(EVP_PKEY_CTX *)style);
  set_style(this,style);
  return;
}

Assistant:

inline Gnuplot::Gnuplot(const std::string &style)
    : gnucmd(NULL),
      valid(false),
      two_dim(false),
      nplots(0) {
  init();
  set_style(style);
}